

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O0

Sexp * Builtin_Sub(Sexp *fst,Sexp *snd)

{
  bool bVar1;
  JetRuntimeException *pJVar2;
  Sexp *pSVar3;
  allocator local_79;
  string local_78 [38];
  undefined1 local_52;
  allocator local_51;
  string local_50 [48];
  FrameProtector local_20;
  FrameProtector __frame_prot;
  Sexp *snd_local;
  Sexp *fst_local;
  
  __frame_prot.protected_frame = (Frame *)snd;
  snd_local = fst;
  FrameProtector::FrameProtector(&local_20,"Builtin_Sub");
  FrameProtector::ProtectValue(&local_20,&snd_local,"fst");
  FrameProtector::ProtectValue(&local_20,(Sexp **)&__frame_prot,"snd");
  bVar1 = Sexp::IsFixnum(snd_local);
  if (!bVar1) {
    local_52 = 1;
    pJVar2 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"type error: not a fixnum",&local_51);
    JetRuntimeException::JetRuntimeException(pJVar2,(string *)local_50);
    local_52 = 0;
    __cxa_throw(pJVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  bVar1 = Sexp::IsFixnum((Sexp *)__frame_prot.protected_frame);
  if (!bVar1) {
    pJVar2 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"type error: not a fixnum",&local_79);
    JetRuntimeException::JetRuntimeException(pJVar2,(string *)local_78);
    __cxa_throw(pJVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  pSVar3 = GcHeap::AllocateFixnum
                     ((snd_local->field_1).fixnum_value -
                      (double)((__frame_prot.protected_frame)->roots).
                              super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  FrameProtector::~FrameProtector(&local_20);
  return pSVar3;
}

Assistant:

Sexp *Builtin_Sub(Sexp *fst, Sexp *snd) {
  GC_HELPER_FRAME;
  GC_PROTECT(fst);
  GC_PROTECT(snd);

  if (!fst->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (!snd->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  return GcHeap::AllocateFixnum(fst->fixnum_value - snd->fixnum_value);
}